

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O0

void __thiscall soplex::SLUFactor<double>::clear(SLUFactor<double> *this)

{
  bool bVar1;
  long in_RDI;
  int in_stack_0000000c;
  int **in_stack_00000010;
  SPxMemoryException *x;
  SSVectorBase<double> *in_stack_ffffffffffffffd0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffff0;
  
  *(undefined8 *)(in_RDI + 0x30) = 0x4014000000000000;
  *(undefined8 *)(in_RDI + 0x38) = 0x4014000000000000;
  *(undefined8 *)(in_RDI + 0x40) = 0x3ff0000000000000;
  *(undefined4 *)(in_RDI + 0x94) = 0;
  *(undefined4 *)(in_RDI + 0x98) = 0;
  *(undefined4 *)(in_RDI + 0x14) = 0;
  *(undefined1 *)(in_RDI + 0x2c8) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x20) = 0x3ff0000000000000;
  *(undefined8 *)(in_RDI + 0x370) = *(undefined8 *)(in_RDI + 0x378);
  *(undefined8 *)(in_RDI + 0x380) = 0x3fa47ae147ae147b;
  *(undefined4 *)(in_RDI + 0x10) = 4;
  VectorBase<double>::clear((VectorBase<double> *)in_stack_ffffffffffffffe0);
  SSVectorBase<double>::clear(in_stack_ffffffffffffffd0);
  SSVectorBase<double>::clear(in_stack_ffffffffffffffd0);
  SSVectorBase<double>::clear(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x128) = 100;
  *(undefined4 *)(in_RDI + 0x188) = 100;
  *(undefined4 *)(in_RDI + 0x68) = 100;
  *(undefined4 *)(in_RDI + 0x90) = 100;
  if (*(long *)(in_RDI + 0xd0) != 0) {
    spx_free<int*>((int **)0x24ea26);
  }
  if (*(long *)(in_RDI + 0xd8) != 0) {
    spx_free<int*>((int **)0x24ea4b);
  }
  if (*(long *)(in_RDI + 0xe0) != 0) {
    spx_free<int*>((int **)0x24ea70);
  }
  if (*(long *)(in_RDI + 0xe8) != 0) {
    spx_free<int*>((int **)0x24ea98);
  }
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffe0);
  if (!bVar1) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x24eace);
  }
  if (*(long *)(in_RDI + 0x148) != 0) {
    spx_free<int*>((int **)0x24eaf6);
  }
  if (*(long *)(in_RDI + 400) != 0) {
    spx_free<int*>((int **)0x24eb22);
  }
  bVar1 = std::vector<double,_std::allocator<double>_>::empty(in_stack_ffffffffffffffe0);
  if (bVar1) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x24eb54);
  }
  if (*(long *)(in_RDI + 0x88) != 0) {
    spx_free<int*>((int **)0x24eb79);
  }
  if (*(long *)(in_RDI + 0xa0) != 0) {
    spx_free<int*>((int **)0x24eb9e);
  }
  if (*(long *)(in_RDI + 0xa8) != 0) {
    spx_free<int*>((int **)0x24ebc3);
  }
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  spx_alloc<int*>(in_stack_00000010,in_stack_0000000c);
  spx_alloc<int*>(in_stack_00000010,in_stack_0000000c);
  std::vector<double,_std::allocator<double>_>::resize
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  spx_alloc<int*>(in_stack_00000010,in_stack_0000000c);
  spx_alloc<int*>(in_stack_00000010,in_stack_0000000c);
  spx_alloc<int*>(in_stack_00000010,in_stack_0000000c);
  return;
}

Assistant:

void SLUFactor<R>::clear()
{

   this->rowMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   this->colMemMult    = 5;          /* factor of minimum Memory * #of nonzeros */
   this->lMemMult      = 1;          /* factor of minimum Memory * #of nonzeros */

   this->l.firstUpdate = 0;
   this->l.firstUnused = 0;
   this->thedim        = 0;

   usetup        = false;
   this->maxabs        = 1;
   this->initMaxabs    = 1;
   lastThreshold = minThreshold;
   minStability  = SOPLEX_MINSTABILITY;
   this->stat          = this->UNLOADED;

   vec.clear();
   eta.clear();
   ssvec.clear();
   forest.clear();

   this->u.row.size    = 100;
   this->u.col.size    = 100;
   this->l.size        = 100;
   this->l.startSize   = 100;

   if(this->l.ridx)
      spx_free(this->l.ridx);

   if(this->l.rbeg)
      spx_free(this->l.rbeg);

   if(this->l.rorig)
      spx_free(this->l.rorig);

   if(this->l.rperm)
      spx_free(this->l.rperm);

   if(!this->u.row.val.empty())
      this->u.row.val.clear();

   if(this->u.row.idx)
      spx_free(this->u.row.idx);

   if(this->u.col.idx)
      spx_free(this->u.col.idx);

   if(this->l.val.empty())
      this->l.val.clear();

   if(this->l.idx)
      spx_free(this->l.idx);

   if(this->l.start)
      spx_free(this->l.start);

   if(this->l.row)
      spx_free(this->l.row);

   // G clear() is used in constructor of SLUFactor<R> so we have to
   // G clean up if anything goes wrong here
   try
   {
      this->u.row.val.resize(this->u.row.size);
      spx_alloc(this->u.row.idx, this->u.row.size);
      spx_alloc(this->u.col.idx, this->u.col.size);

      this->l.val.resize(this->l.size);
      spx_alloc(this->l.idx,   this->l.size);
      spx_alloc(this->l.start, this->l.startSize);
      spx_alloc(this->l.row,   this->l.startSize);
   }
   catch(const SPxMemoryException& x)
   {
      freeAll();
      throw x;
   }
}